

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O1

void * __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
::consume_operation::element_ptr(consume_operation *this)

{
  uintptr_t uint_pointer;
  ControlBlock *pCVar1;
  
  if ((this->m_consume_data).m_next_ptr < 0x10) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
               ,0x403);
  }
  pCVar1 = (this->m_consume_data).m_control + 2;
  if (((this->m_consume_data).m_next_ptr & 4) != 0) {
    pCVar1 = (ControlBlock *)pCVar1->m_next;
  }
  return pCVar1;
}

Assistant:

void * element_ptr() const noexcept
            {
                DENSITY_ASSERT(!empty());
                return Base::get_element(m_consume_data.m_control, m_consume_data.external());
            }